

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
util::
dynamic_array<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>,_unsigned_long,_long>
::dynamic_array(dynamic_array<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>,_std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>,_unsigned_long,_long>
                *this,size_type_conflict count_in,const_reference value_in,allocator_type *alloc_in)

{
  fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_> *pfVar1;
  fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_> *this_00;
  allocator_type my_alloc;
  allocator_type local_19;
  
  this->_vptr_dynamic_array = (_func_int **)&PTR__dynamic_array_00218d18;
  this->elem_count = count_in;
  this->elems = (pointer)0x0;
  if (count_in != 0) {
    pfVar1 = (fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_> *)
             std::
             allocator_traits<std::allocator<math::wide_integer::uintwide_t<2048U,_unsigned_int,_std::allocator<unsigned_int>,_false>_>_>
             ::allocate(&local_19,count_in);
    this->elems = (pointer)pfVar1;
    for (this_00 = pfVar1; this_00 != pfVar1 + this->elem_count * 0x18; this_00 = this_00 + 0x18) {
      math::wide_integer::detail::
      fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_>::fixed_dynamic_array
                (this_00,&value_in->values);
      pfVar1 = (fixed_dynamic_array<unsigned_int,_64U,_std::allocator<unsigned_int>_> *)this->elems;
    }
  }
  return;
}

Assistant:

explicit constexpr dynamic_array(size_type count_in,
                                     const_reference value_in = value_type(),
                                     const allocator_type& alloc_in = allocator_type())
      : elem_count(count_in)
    {
      if(elem_count > static_cast<size_type>(UINT8_C(0)))
      {
        allocator_type my_alloc(alloc_in);

        elems = std::allocator_traits<allocator_type>::allocate(my_alloc, elem_count);

        iterator it = begin();

        while(it != end())
        {
          std::allocator_traits<allocator_type>::construct(my_alloc, it, value_in);

          ++it;
        }
      }
    }